

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

Maybe<kj::Own<kj::_::Event>_> __thiscall kj::TaskSet::Task::fire(Task *this)

{
  ErrorHandler *pEVar1;
  Task *pTVar2;
  Own<kj::TaskSet::Task> *this_00;
  PromiseFulfiller<void> *pPVar3;
  anon_class_8_1_8991fb9c_for_func *func;
  Event *extraout_RDX;
  Task *in_RSI;
  Maybe<kj::Own<kj::_::Event>_> MVar4;
  Fault f;
  Own<kj::_::Event> self;
  ExceptionOr<kj::_::Void> result;
  kj local_450 [8];
  NullableValue<kj::Exception> local_448;
  NullableValue<kj::Exception> local_2e8;
  NullableValue<kj::Exception> local_188;
  undefined1 local_28;
  
  local_188.isSet = false;
  local_28 = 0;
  (*((in_RSI->node).ptr)->_vptr_PromiseNode[2])();
  runCatchingExceptions<kj::TaskSet::Task::fire()::_lambda()_1_>
            ((Maybe<kj::Exception> *)&local_448,local_450,func);
  kj::_::NullableValue<kj::Exception>::NullableValue(&local_2e8,&local_448);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_448);
  if (local_2e8.isSet == true) {
    kj::_::ExceptionOrValue::addException((ExceptionOrValue *)&local_188,&local_2e8.field_1.value);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_2e8);
  if (local_188.isSet == true) {
    pEVar1 = in_RSI->taskSet->errorHandler;
    (**pEVar1->_vptr_ErrorHandler)(pEVar1,&local_188.field_1);
  }
  pTVar2 = (in_RSI->next).ptr.ptr;
  this_00 = &in_RSI->prev->ptr;
  if (pTVar2 != (Task *)0x0) {
    pTVar2->prev = (Maybe<kj::Own<kj::TaskSet::Task>_> *)this_00;
  }
  if ((this_00 != (Own<kj::TaskSet::Task> *)0x0) &&
     (local_2e8.field_1.value.ownFile.content.ptr = (char *)this_00->ptr,
     (Task *)local_2e8.field_1.value.ownFile.content.ptr != (Task *)0x0)) {
    local_2e8._0_8_ = this_00->disposer;
    this_00->ptr = (Task *)0x0;
    if ((Task *)local_2e8.field_1.value.ownFile.content.ptr == in_RSI) {
      Own<kj::TaskSet::Task>::operator=(this_00,&(in_RSI->next).ptr);
      local_448.isSet = false;
      local_448._1_7_ = 0;
      local_448.field_1.value.ownFile.content.ptr = (char *)0x0;
      Own<kj::TaskSet::Task>::operator=(&(in_RSI->next).ptr,(Own<kj::TaskSet::Task> *)&local_448);
      Own<kj::TaskSet::Task>::dispose((Own<kj::TaskSet::Task> *)&local_448);
      in_RSI->prev = (Maybe<kj::Own<kj::TaskSet::Task>_> *)0x0;
      pPVar3 = (in_RSI->taskSet->emptyFulfiller).ptr.ptr;
      if ((pPVar3 != (PromiseFulfiller<void> *)0x0) &&
         ((in_RSI->taskSet->tasks).ptr.ptr == (Task *)0x0)) {
        (**pPVar3->_vptr_PromiseFulfiller)(pPVar3,&local_448);
        local_448.isSet = false;
        local_448._1_7_ = 0;
        local_448.field_1.value.ownFile.content.ptr = (char *)0x0;
        Own<kj::PromiseFulfiller<void>_>::operator=
                  (&(in_RSI->taskSet->emptyFulfiller).ptr,
                   (Own<kj::PromiseFulfiller<void>_> *)&local_448);
        Own<kj::PromiseFulfiller<void>_>::dispose((Own<kj::PromiseFulfiller<void>_> *)&local_448);
      }
      (this->super_Event)._vptr_Event = (_func_int **)local_2e8._0_8_;
      (this->super_Event).loop = (EventLoop *)local_2e8.field_1.value.ownFile.content.ptr;
      local_2e8.field_1.value.ownFile.content.ptr = (char *)0x0;
      Own<kj::_::Event>::dispose((Own<kj::_::Event> *)&local_2e8);
      kj::_::NullableValue<kj::Exception>::~NullableValue(&local_188);
      MVar4.ptr.ptr = extraout_RDX;
      MVar4.ptr.disposer = (Disposer *)this;
      return (Maybe<kj::Own<kj::_::Event>_>)MVar4.ptr;
    }
    kj::_::Debug::Fault::Fault
              ((Fault *)&local_448,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
               ,0xc4,FAILED,"self.get() == this","");
    kj::_::Debug::Fault::fatal((Fault *)&local_448);
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&local_448,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
             ,0xc3,FAILED,"*prev != nullptr","");
  kj::_::Debug::Fault::fatal((Fault *)&local_448);
}

Assistant:

Maybe<Own<Event>> fire() override {
    // Get the result.
    _::ExceptionOr<_::Void> result;
    node->get(result);

    // Delete the node, catching any exceptions.
    KJ_IF_MAYBE(exception, kj::runCatchingExceptions([this]() {
      node = nullptr;
    })) {
      result.addException(kj::mv(*exception));
    }

    // Call the error handler if there was an exception.
    KJ_IF_MAYBE(e, result.exception) {
      taskSet.errorHandler.taskFailed(kj::mv(*e));
    }

    // Remove from the task list.
    KJ_IF_MAYBE(n, next) {
      n->get()->prev = prev;
    }
    Own<Event> self = kj::mv(KJ_ASSERT_NONNULL(*prev));
    KJ_ASSERT(self.get() == this);
    *prev = kj::mv(next);
    next = nullptr;
    prev = nullptr;

    KJ_IF_MAYBE(f, taskSet.emptyFulfiller) {
      if (taskSet.tasks == nullptr) {
        f->get()->fulfill();
        taskSet.emptyFulfiller = nullptr;
      }
    }

    return mv(self);
  }